

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filtered_zigzag_persistence.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* get_boundaries(void)

{
  long lVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDI;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  initializer_list<int> __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<int> __l_20;
  initializer_list<int> __l_21;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_22;
  allocator_type local_3b4;
  allocator_type local_3b3;
  allocator_type local_3b2;
  allocator_type local_3b1;
  allocator_type local_3b0;
  allocator_type local_3af;
  allocator_type local_3ae;
  allocator_type local_3ad;
  allocator_type local_3ac;
  allocator_type local_3ab;
  allocator_type local_3aa;
  allocator_type local_3a9;
  allocator_type local_3a8;
  allocator_type local_3a7;
  allocator_type local_3a6;
  allocator_type local_3a5;
  allocator_type local_3a4;
  allocator_type local_3a3;
  allocator_type local_3a2;
  allocator_type local_3a1;
  allocator_type local_3a0;
  allocator_type local_39f;
  allocator_type local_39e;
  allocator_type local_39d;
  int local_39c [49];
  _Vector_base<int,_std::allocator<int>_> local_2d8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  vector<int,_std::allocator<int>_> local_290;
  vector<int,_std::allocator<int>_> local_278;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  vector<int,_std::allocator<int>_> local_248;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  vector<int,_std::allocator<int>_> local_218;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  vector<int,_std::allocator<int>_> local_1d0;
  vector<int,_std::allocator<int>_> local_1b8;
  vector<int,_std::allocator<int>_> local_1a0;
  vector<int,_std::allocator<int>_> local_188;
  vector<int,_std::allocator<int>_> local_170;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> local_38;
  
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_2c0 = 0;
  local_298 = 0;
  local_2d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_39c[0x16] = 0;
  local_39c[0x17] = 1;
  __l._M_len = 2;
  __l._M_array = local_39c + 0x16;
  std::vector<int,_std::allocator<int>_>::vector(&local_290,__l,&local_39d);
  local_39c[0x14] = 0;
  local_39c[0x15] = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_39c + 0x14;
  std::vector<int,_std::allocator<int>_>::vector(&local_278,__l_00,&local_39e);
  local_250 = 0;
  local_260 = 0;
  uStack_258 = 0;
  local_39c[0x12] = 1;
  local_39c[0x13] = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_39c + 0x12;
  std::vector<int,_std::allocator<int>_>::vector(&local_248,__l_01,&local_39f);
  local_220 = 0;
  local_230 = 0;
  uStack_228 = 0;
  local_39c[0x10] = 5;
  local_39c[0x11] = 7;
  __l_02._M_len = 2;
  __l_02._M_array = local_39c + 0x10;
  std::vector<int,_std::allocator<int>_>::vector(&local_218,__l_02,&local_3a0);
  local_200 = 0;
  uStack_1f8 = 0;
  local_1f0 = 0;
  local_39c[0x2a] = 3;
  local_39c[0x2b] = 4;
  local_39c[0x2c] = 6;
  __l_03._M_len = 3;
  __l_03._M_array = local_39c + 0x2a;
  std::vector<int,_std::allocator<int>_>::vector(&local_1e8,__l_03,&local_3a1);
  local_39c[0xe] = 7;
  local_39c[0xf] = 9;
  __l_04._M_len = 2;
  __l_04._M_array = local_39c + 0xe;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,__l_04,&local_3a2);
  local_39c[0xc] = 5;
  local_39c[0xd] = 9;
  __l_05._M_len = 2;
  __l_05._M_array = local_39c + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b8,__l_05,&local_3a3);
  local_39c[0x27] = 8;
  local_39c[0x28] = 0xb;
  local_39c[0x29] = 0xc;
  __l_06._M_len = 3;
  __l_06._M_array = local_39c + 0x27;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a0,__l_06,&local_3a4);
  local_39c[5] = 10;
  __l_07._M_len = 1;
  __l_07._M_array = local_39c + 5;
  std::vector<int,_std::allocator<int>_>::vector(&local_188,__l_07,&local_3a5);
  local_39c[4] = 0xd;
  __l_08._M_len = 1;
  __l_08._M_array = local_39c + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_08,&local_3a6);
  local_39c[10] = 1;
  local_39c[0xb] = 7;
  __l_09._M_len = 2;
  __l_09._M_array = local_39c + 10;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_09,&local_3a7);
  local_39c[0x24] = 3;
  local_39c[0x25] = 4;
  local_39c[0x26] = 6;
  __l_10._M_len = 3;
  __l_10._M_array = local_39c + 0x24;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_10,&local_3a8);
  local_39c[8] = 2;
  local_39c[9] = 7;
  __l_11._M_len = 2;
  __l_11._M_array = local_39c + 8;
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__l_11,&local_3a9);
  local_39c[0x21] = 8;
  local_39c[0x22] = 0xb;
  local_39c[0x23] = 0xc;
  __l_12._M_len = 3;
  __l_12._M_array = local_39c + 0x21;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l_12,&local_3aa);
  local_39c[6] = 0;
  local_39c[7] = 7;
  __l_13._M_len = 2;
  __l_13._M_array = local_39c + 6;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_13,&local_3ab);
  local_39c[0x1e] = 4;
  local_39c[0x1f] = 0x12;
  local_39c[0x20] = 0x14;
  __l_14._M_len = 3;
  __l_14._M_array = local_39c + 0x1e;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_14,&local_3ac);
  local_39c[0x1b] = 6;
  local_39c[0x1c] = 0x10;
  local_39c[0x1d] = 0x12;
  __l_15._M_len = 3;
  __l_15._M_array = local_39c + 0x1b;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_15,&local_3ad);
  local_39c[0x18] = 3;
  local_39c[0x19] = 0x10;
  local_39c[0x1a] = 0x14;
  __l_16._M_len = 3;
  __l_16._M_array = local_39c + 0x18;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_16,&local_3ae);
  local_39c[3] = 0x13;
  __l_17._M_len = 1;
  __l_17._M_array = local_39c + 3;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_17,&local_3af);
  local_39c[2] = 8;
  __l_18._M_len = 1;
  __l_18._M_array = local_39c + 2;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l_18,&local_3b0);
  local_39c[1] = 0xc;
  __l_19._M_len = 1;
  __l_19._M_array = local_39c + 1;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l_19,&local_3b1);
  local_39c[0x2d] = 0x11;
  local_39c[0x2e] = 0x15;
  local_39c[0x2f] = 0x16;
  local_39c[0x30] = 0x17;
  __l_20._M_len = 4;
  __l_20._M_array = local_39c + 0x2d;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l_20,&local_3b2);
  local_39c[0] = 0x1b;
  __l_21._M_len = 1;
  __l_21._M_array = local_39c;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l_21,&local_3b3);
  __l_22._M_len = 0x1d;
  __l_22._M_array = (iterator)&local_2d8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_RDI,__l_22,&local_3b4);
  lVar1 = 0x2a0;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&local_2d8._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

std::vector<std::vector<int> > get_boundaries() {
  return {{},
          {},
          {},
          {0, 1},
          {0, 2},
          {},
          {1, 2},
          {},
          {5, 7},
          {},
          {3, 4, 6},
          {7, 9},
          {5, 9},
          {8, 11, 12},
          {10},                         // remove
          {13},                         // remove
          {1, 7},
          {3, 4, 6},
          {2, 7},
          {8, 11, 12},
          {0, 7},
          {4, 18, 20},
          {6, 16, 18},
          {3, 16, 20},
          {19},                         // remove
          {8},                          // remove
          {12},                         // remove
          {17, 21, 22, 23},
          {27}};                        // remove
}